

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::convertGlslangToSpvType
          (TGlslangToSpvTraverser *this,TType *type,TLayoutPacking explicitLayout,
          TQualifier *qualifier,bool lastBufferBlockMember,bool forwardReferenceOnly)

{
  map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
  *this_00;
  set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_> *psVar1;
  __index_type _Var2;
  char cVar3;
  TSpirvType *this_01;
  pointer pTVar4;
  TGlslangToSpvTraverser *this_02;
  TVector<glslang::TArraySize> *pTVar5;
  _Alloc_hider _Var6;
  pointer pIVar7;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_03;
  bool bVar8;
  int iVar9;
  int iVar10;
  TLayoutPacking explicitLayout_00;
  Id IVar11;
  Dim DVar12;
  ImageFormat format;
  mapped_type id;
  Decoration DVar13;
  BuiltIn num;
  int iVar14;
  Id IVar15;
  Id IVar16;
  Id IVar17;
  uint uVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *pmVar22;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 extraout_var;
  undefined4 extraout_var_05;
  const_iterator cVar23;
  undefined4 extraout_var_06;
  uint *puVar24;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  mapped_type_conflict *pmVar25;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  pointer pTVar26;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  ulong uVar27;
  _Base_ptr p_Var28;
  long lVar29;
  long lVar30;
  TIntermediate *pTVar31;
  bool forwardReferenceOnly_00;
  _Rb_tree_header *p_Var32;
  _Base_ptr p_Var33;
  char *pcVar34;
  _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var35;
  Op opcode;
  TType *pTVar36;
  TQualifier *pTVar37;
  Id *pIVar38;
  undefined8 *puVar39;
  TQualifier *pTVar40;
  pointer ppVar41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__s;
  undefined7 in_register_00000081;
  uint uVar42;
  bool bVar43;
  ulong uVar44;
  Builder *pBVar45;
  long lVar46;
  pointer pTVar47;
  byte bVar48;
  bool local_1e9;
  Builder *local_1e8;
  int offset;
  int local_1dc;
  TQualifier *local_1d8;
  TQualifier *local_1d0;
  int local_1c4;
  _Rb_tree_header *local_1c0;
  _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1b8;
  TTypeList *local_1b0;
  uint local_1a4;
  Builder *local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvMembers;
  Id spvMember;
  undefined4 uStack_174;
  undefined1 auStack_170 [8];
  TType local_168;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_d0;
  TTypeList *glslangMembers;
  TTypeList *local_c0;
  int local_b4;
  undefined4 local_b0;
  int dummyStride;
  TQualifier memberQualifier;
  vector<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
  deferredForwardPointers;
  undefined4 extraout_var_07;
  
  bVar48 = 0;
  local_b0 = (undefined4)CONCAT71(in_register_00000081,lastBufferBlockMember);
  pTVar36 = type;
  local_1d8 = qualifier;
  iVar9 = (*type->_vptr_TType[7])(type);
  switch(iVar9) {
  case 0:
    id = spv::Builder::makeVoidType(&this->builder);
    iVar9 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar9 != '\0') {
      __assert_fail("! type.isArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1356,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    break;
  case 1:
    iVar9 = 0x20;
    goto LAB_00440955;
  case 2:
    iVar9 = 0x40;
    goto LAB_00440955;
  case 3:
    iVar9 = 0x10;
LAB_00440955:
    id = spv::Builder::makeFloatType(&this->builder,iVar9);
    break;
  case 4:
    iVar9 = 8;
    goto LAB_004409a3;
  case 5:
    iVar9 = 8;
    goto LAB_0044093d;
  case 6:
    iVar9 = 0x10;
    goto LAB_004409a3;
  case 7:
    iVar9 = 0x10;
    goto LAB_0044093d;
  case 8:
    iVar9 = 0x20;
    goto LAB_004409a3;
  case 9:
    goto LAB_004406c1;
  case 10:
    iVar9 = 0x40;
LAB_004409a3:
    bVar8 = true;
LAB_004409a8:
    id = spv::Builder::makeIntegerType(&this->builder,iVar9,bVar8);
    break;
  case 0xb:
    iVar9 = 0x40;
    goto LAB_0044093d;
  case 0xc:
    if (explicitLayout == ElpNone) {
      id = spv::Builder::makeBoolType(&this->builder);
      break;
    }
    goto LAB_004406c1;
  case 0xd:
    spvMember = 0x15;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&spvMember);
LAB_004406c1:
    iVar9 = 0x20;
LAB_0044093d:
    bVar8 = false;
    goto LAB_004409a8;
  case 0xe:
    iVar9 = (*type->_vptr_TType[8])(type);
    puVar24 = (uint *)CONCAT44(extraout_var_07,iVar9);
    pBVar45 = &this->builder;
    if ((*puVar24 >> 0x15 & 1) == 0) {
      IVar11 = getSampledType(this,(TSampler *)(ulong)*puVar24);
      local_1d0 = (TQualifier *)CONCAT44(local_1d0._4_4_,IVar11);
      DVar12 = TranslateDimensionality((TSampler *)(ulong)*puVar24);
      local_1b8 = (_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)CONCAT44(local_1b8._4_4_,DVar12);
      uVar42 = *puVar24;
      format = TranslateImageFormat(this,type);
      id = spv::Builder::makeImageType
                     (pBVar45,(Id)local_1d0,(Dim)local_1b8,(bool)((byte)(uVar42 >> 0x11) & 1),
                      (bool)((byte)(uVar42 >> 0x10) & 1),(bool)((byte)(uVar42 >> 0x12) & 1),
                      ((uVar42 >> 0x13 & 1) != 0) + 1,format);
      if (((*puVar24 >> 0x14 & 1) != 0) &&
         (((*puVar24 & 0xff00) != 0x600 || ((this->glslangIntermediate->spvVersion).spv < 0x10600)))
         ) {
        id = spv::Builder::makeSampledImageType(pBVar45,id);
      }
    }
    else {
      id = spv::Builder::makeSamplerType(pBVar45);
    }
    break;
  case 0xf:
  case 0x10:
    iVar9 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar9 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    glslangMembers = (type->field_13).structure;
    uVar44 = *(ulong *)&local_1d8->field_0x8;
    if (((uint)uVar44 >> 0x1c & 1) == 0) {
      if ((~*(uint *)&local_1d8->field_0x1c & 0xfff) != 0) {
        iVar9 = (*type->_vptr_TType[7])(type);
        if (iVar9 == 0x10) goto LAB_0043fe2b;
        uVar44 = *(ulong *)&local_1d8->field_0x8;
      }
      pmVar19 = std::__detail::
                _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)(this->structMap[explicitLayout] + (uVar44 >> 0x3d)),&glslangMembers
                            );
      id = *pmVar19;
      if (id != 0) break;
    }
LAB_0043fe2b:
    iVar9 = (*type->_vptr_TType[7])(type);
    if (iVar9 == 0x10) {
      pmVar20 = std::__detail::
                _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->glslangTypeToIdMap,&glslangMembers);
      pmVar21 = std::__detail::
                _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->memberRemapper,pmVar20);
      std::vector<int,_std::allocator<int>_>::resize
                (pmVar21,(long)(glslangMembers->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(glslangMembers->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
    }
    local_1b0 = glslangMembers;
    iVar9 = 0;
    spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deferredForwardPointers.
    super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deferredForwardPointers.
    super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deferredForwardPointers.
    super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar26 = (glslangMembers->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(glslangMembers->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar26) >> 5)) {
      local_1d0 = (TQualifier *)&this->memberRemapper;
      local_1b8 = (_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->glslangTypeToIdMap;
      local_1c0 = &(this->forwardPointers)._M_t._M_impl.super__Rb_tree_header;
      local_d0 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&(this->builder).debugTypeLocs;
      uVar44 = 0;
      do {
        iVar14 = (*(pTVar26[uVar44].type)->_vptr_TType[3])();
        if ((char)iVar14 == '\0') {
          pTVar26 = pTVar26 + uVar44;
          iVar14 = (*type->_vptr_TType[7])(type);
          if (iVar14 == 0x10) {
            bVar8 = filterMember(this,pTVar26->type);
            if (bVar8) goto LAB_0043ff4a;
            pmVar20 = std::__detail::
                      _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1b8,&local_1b0);
            pmVar21 = std::__detail::
                      _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1d0,pmVar20);
            (pmVar21->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[uVar44] = (int)uVar44 - iVar9;
          }
          iVar14 = (*pTVar26->type->_vptr_TType[10])();
          pTVar37 = local_1d8;
          puVar39 = (undefined8 *)CONCAT44(extraout_var_00,iVar14);
          pTVar40 = &memberQualifier;
          for (lVar29 = 10; lVar29 != 0; lVar29 = lVar29 + -1) {
            pTVar40->semanticName = (char *)*puVar39;
            puVar39 = puVar39 + (ulong)bVar48 * -2 + 1;
            pTVar40 = (TQualifier *)((long)pTVar40 + (ulong)bVar48 * -0x10 + 8);
          }
          InheritQualifiers(&memberQualifier,local_1d8);
          if (((~memberQualifier._28_4_ & 0xfff) == 0) &&
             (uVar27 = *(ulong *)&pTVar37->field_0x1c & 0xfff, uVar27 != 0xfff)) {
            memberQualifier._28_8_ = uVar27 | memberQualifier._28_8_ & 0xfffffffffffff000;
          }
          if ((*(uint *)&pTVar37->field_0x8 & 0x7f) == 6) {
            bVar8 = uVar44 == (int)((ulong)((long)(local_1b0->
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_1b0->
                                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ).
                                                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) -
                              1;
          }
          else {
            bVar8 = false;
          }
          iVar14 = (*pTVar26->type->_vptr_TType[7])();
          if (iVar14 == 0x12) {
            iVar14 = (*pTVar26->type->_vptr_TType[0x15])();
            uVar27 = CONCAT44(extraout_var_01,iVar14);
            p_Var28 = (this->forwardPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            p_Var32 = local_1c0;
            if (p_Var28 != (_Base_ptr)0x0) {
              do {
                if (*(ulong *)(p_Var28 + 1) >= uVar27) {
                  p_Var32 = (_Rb_tree_header *)p_Var28;
                }
                p_Var28 = (&p_Var28->_M_left)[*(ulong *)(p_Var28 + 1) < uVar27];
              } while (p_Var28 != (_Base_ptr)0x0);
              if ((p_Var32 != local_1c0) && (p_Var32->_M_node_count <= uVar27)) goto LAB_00440103;
            }
            _spvMember = (pointer)pTVar26->type;
            pTVar37 = &memberQualifier;
            puVar39 = (undefined8 *)auStack_170;
            for (lVar29 = 10; lVar29 != 0; lVar29 = lVar29 + -1) {
              *puVar39 = pTVar37->semanticName;
              pTVar37 = (TQualifier *)((long)pTVar37 + (ulong)bVar48 * -0x10 + 8);
              puVar39 = puVar39 + (ulong)bVar48 * -2 + 1;
            }
            if (deferredForwardPointers.
                super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                deferredForwardPointers.
                super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<glslang::TType*,glslang::TQualifier>,std::allocator<std::pair<glslang::TType*,glslang::TQualifier>>>
              ::_M_realloc_insert<std::pair<glslang::TType*,glslang::TQualifier>>
                        ((vector<std::pair<glslang::TType*,glslang::TQualifier>,std::allocator<std::pair<glslang::TType*,glslang::TQualifier>>>
                          *)&deferredForwardPointers,
                         (iterator)
                         deferredForwardPointers.
                         super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (pair<glslang::TType_*,_glslang::TQualifier> *)&spvMember);
            }
            else {
              pIVar38 = &spvMember;
              ppVar41 = deferredForwardPointers.
                        super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (lVar29 = 0xb; lVar29 != 0; lVar29 = lVar29 + -1) {
                ppVar41->first = *(TType **)pIVar38;
                pIVar38 = pIVar38 + (ulong)bVar48 * -4 + 2;
                ppVar41 = (pointer)((long)ppVar41 + (ulong)bVar48 * -0x10 + 8);
              }
              deferredForwardPointers.
              super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   deferredForwardPointers.
                   super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
LAB_00440103:
          pTVar36 = pTVar26->type;
          iVar14 = (*pTVar36->_vptr_TType[7])(pTVar36);
          IVar11 = convertGlslangToSpvType
                             (this,pTVar36,explicitLayout,&memberQualifier,bVar8,iVar14 == 0x12);
          spvMember = IVar11;
          if (spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&spvMembers,
                       (iterator)
                       spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&spvMember);
          }
          else {
            *spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = IVar11;
            spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar14 = iVar9;
          if (this->options->emitNonSemanticShaderDebugInfo == true) {
            iVar9 = (*pTVar26->type->_vptr_TType[6])();
            this_03 = local_d0;
            pcVar34 = *(char **)(CONCAT44(extraout_var_02,iVar9) + 8);
            pmVar22 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_d0,&spvMember);
            local_1a0 = (Builder *)(pmVar22->name)._M_string_length;
            strlen(pcVar34);
            std::__cxx11::string::_M_replace((ulong)pmVar22,0,(char *)local_1a0,(ulong)pcVar34);
            iVar9 = (pTVar26->loc).line;
            pmVar22 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](this_03,&spvMember);
            pmVar22->line = iVar9;
            iVar9 = (pTVar26->loc).column;
            pmVar22 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](this_03,&spvMember);
            pmVar22->column = iVar9;
          }
        }
        else {
          iVar10 = (*type->_vptr_TType[7])(type);
          iVar14 = iVar9 + 1;
          if (iVar10 == 0x10) {
LAB_0043ff4a:
            pmVar20 = std::__detail::
                      _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1b8,&local_1b0);
            pmVar21 = std::__detail::
                      _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1d0,pmVar20);
            (pmVar21->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[uVar44] = -1;
            iVar14 = iVar9 + 1;
          }
        }
        iVar9 = iVar14;
        uVar44 = uVar44 + 1;
        pTVar26 = (local_1b0->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar44 <
               (long)(int)((ulong)((long)(local_1b0->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar26)
                          >> 5));
    }
    pBVar45 = &this->builder;
    iVar9 = (*type->_vptr_TType[5])(type);
    id = spv::Builder::makeStructType
                   (pBVar45,&spvMembers,*(char **)(CONCAT44(extraout_var_03,iVar9) + 8),false);
    uVar44 = *(ulong *)&local_1d8->field_0x8;
    if (((uint)uVar44 >> 0x1c & 1) == 0) {
      if ((~*(uint *)&local_1d8->field_0x1c & 0xfff) != 0) {
        iVar9 = (*type->_vptr_TType[7])(type);
        if (iVar9 == 0x10) goto LAB_004402b0;
        uVar44 = *(ulong *)&local_1d8->field_0x8;
      }
      pmVar19 = std::__detail::
                _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)(this->structMap[explicitLayout] + (uVar44 >> 0x3d)),&local_1b0);
      *pmVar19 = id;
    }
LAB_004402b0:
    local_c0 = local_1b0;
    offset = -1;
    if (((type->arraySizes == (TArraySizes *)0x0) ||
        (pTVar5 = (type->arraySizes->sizes).sizes, pTVar5 == (TVector<glslang::TArraySize> *)0x0))
       || (local_1a4 = (uint)CONCAT71((int7)((ulong)pTVar5 >> 8),1),
          (int)((ulong)((long)(pTVar5->
                              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ).
                              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar5->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2)) {
      iVar9 = (*type->_vptr_TType[0x1d])(type);
      if ((char)iVar9 == '\0') {
        local_1a4 = 0;
      }
      else {
        iVar9 = (*type->_vptr_TType[0xb])(type);
        bVar8 = glslang::TQualifier::isArrayedIo
                          ((TQualifier *)CONCAT44(extraout_var_04,iVar9),
                           this->glslangIntermediate->language);
        local_1a4 = (uint)CONCAT71(extraout_var,bVar8) ^ 1;
      }
    }
    pTVar26 = (local_c0->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_1a0 = pBVar45;
    if (0 < (int)((ulong)((long)(local_c0->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar26) >> 5)) {
      local_d0 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->memberRemapper;
      local_168.spirvType = (TSpirvType *)&(this->builder).capabilities;
      p_Var35 = (_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)0x0;
      do {
        pTVar36 = pTVar26[(long)p_Var35].type;
        iVar9 = (*type->_vptr_TType[7])(type);
        uVar42 = (uint)p_Var35;
        if (iVar9 == 0x10) {
          pmVar20 = std::__detail::
                    _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->glslangTypeToIdMap,&local_c0);
          pmVar21 = std::__detail::
                    _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_d0,pmVar20);
          uVar42 = (pmVar21->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[(long)p_Var35];
          bVar8 = filterMember(this,pTVar36);
          if (!bVar8) goto LAB_00440ce6;
        }
        else {
LAB_00440ce6:
          iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
          puVar39 = (undefined8 *)CONCAT44(extraout_var_15,iVar9);
          pTVar37 = &memberQualifier;
          for (lVar29 = 10; lVar29 != 0; lVar29 = lVar29 + -1) {
            pTVar37->semanticName = (char *)*puVar39;
            puVar39 = puVar39 + (ulong)bVar48 * -2 + 1;
            pTVar37 = (TQualifier *)((long)pTVar37 + (ulong)bVar48 * -0x10 + 8);
          }
          InheritQualifiers(&memberQualifier,local_1d8);
          if (-1 < (int)uVar42) {
            iVar9 = (*pTVar36->_vptr_TType[6])(pTVar36);
            spv::Builder::addMemberName
                      (pBVar45,id,uVar42,*(char **)(CONCAT44(extraout_var_16,iVar9) + 8));
            local_1d0 = (TQualifier *)memberQualifier._8_8_;
            local_1c0 = (_Rb_tree_header *)((ulong)memberQualifier._8_8_ >> 0x3d);
            DVar13 = TranslateLayoutDecoration(pTVar36,memberQualifier._12_4_ >> 0x1d);
            spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DVar13,-1);
            iVar9 = (*pTVar36->_vptr_TType[0xb])(pTVar36);
            DVar13 = DecorationMax;
            if ((*(uint *)(CONCAT44(extraout_var_17,iVar9) + 8) >> 0x19 & 7) - 1 < 2) {
              DVar13 = DecorationRelaxedPrecision;
            }
            spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DVar13,-1);
            iVar9 = (*type->_vptr_TType[0xb])(type);
            local_1b8 = p_Var35;
            if ((((*(uint *)(CONCAT44(extraout_var_18,iVar9) + 8) & 0x7f) == 3) ||
                (iVar9 = (*type->_vptr_TType[0xb])(type),
                (*(uint *)(CONCAT44(extraout_var_19,iVar9) + 8) & 0x7f) == 4)) &&
               ((iVar9 = (*type->_vptr_TType[7])(type), pTVar37 = local_1d0, iVar9 == 0x10 ||
                (this->glslangIntermediate->source == EShSourceHlsl)))) {
              DVar13 = TranslateInterpolationDecoration(this,local_1d0);
              spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DVar13,-1);
              DVar13 = TranslateAuxiliaryStorageDecoration(this,pTVar37);
              spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DVar13,-1);
              addMeshNVDecoration(this,id,uVar42,&memberQualifier);
            }
            DVar13 = DecorationInvariant;
            if (((Id)local_1d0 >> 0x1c & 1) == 0) {
              DVar13 = DecorationMax;
            }
            spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DVar13,-1);
            iVar9 = (*type->_vptr_TType[7])(type);
            if ((iVar9 == 0x10) && ((*(uint *)&local_1d8->field_0x8 & 0x7f) == 6)) {
              _spvMember = (pointer)0x0;
              auStack_170 = (undefined1  [8])0x0;
              local_168._vptr_TType = (_func_int **)0x0;
              TranslateMemoryDecoration
                        (&memberQualifier,
                         (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&spvMember,
                         this->glslangIntermediate->useVulkanMemoryModel);
              if (auStack_170 != (undefined1  [8])_spvMember) {
                uVar44 = 0;
                uVar27 = 1;
                do {
                  spv::Builder::addMemberDecoration
                            (pBVar45,id,uVar42,*(Decoration *)(_spvMember + uVar44 * 4),-1);
                  bVar8 = uVar27 < (ulong)((long)auStack_170 - (long)_spvMember >> 2);
                  uVar44 = uVar27;
                  uVar27 = (ulong)((int)uVar27 + 1);
                } while (bVar8);
              }
              if ((TType *)_spvMember != (TType *)0x0) {
                operator_delete(_spvMember,(long)local_168._vptr_TType - (long)_spvMember);
              }
            }
            if (((char)local_1a4 == '\0') && ((~memberQualifier._28_4_ & 0xfff) != 0)) {
              spv::Builder::addMemberDecoration
                        (pBVar45,id,uVar42,DecorationLocation,memberQualifier._28_4_ & 0xfff);
            }
            iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
            if ((*(uint *)(CONCAT44(extraout_var_20,iVar9) + 0x1c) & 0x7000) != 0x4000) {
              iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
              spv::Builder::addMemberDecoration
                        (pBVar45,id,uVar42,Component,
                         *(uint *)(CONCAT44(extraout_var_21,iVar9) + 0x1c) >> 0xc & 7);
            }
            iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
            if ((~*(uint *)(CONCAT44(extraout_var_22,iVar9) + 0x24) & 0x7ffc0000) == 0) {
              iVar9 = offset;
              if (explicitLayout != ElpNone) {
                iVar9 = (*pTVar36->_vptr_TType[0xb])(pTVar36);
                if (*(int *)(CONCAT44(extraout_var_23,iVar9) + 0x14) != -1) {
                  iVar9 = (*pTVar36->_vptr_TType[0xb])(pTVar36);
                  offset = *(int *)(CONCAT44(extraout_var_24,iVar9) + 0x14);
                }
                if (offset < 0) {
                  offset = 0;
                }
                iVar14 = (int)local_1c0;
                local_1dc = glslang::TIntermediate::getMemberAlignment
                                      (pTVar36,(int *)&spvMember,&dummyStride,explicitLayout,
                                       iVar14 == 1);
                iVar9 = (*pTVar36->_vptr_TType[0x1b])(pTVar36);
                local_1e9 = SUB41(iVar9,0);
                iVar9 = (*pTVar36->_vptr_TType[0x1c])(pTVar36);
                if ((char)iVar9 != '\0') {
                  iVar9 = (*pTVar36->_vptr_TType[(ulong)(iVar14 == 1) + 0xd])(pTVar36);
                  local_1e9 = iVar9 == 1;
                }
                iVar9 = local_1dc;
                if ((this->glslangIntermediate->hlslOffsets == true) &&
                   (iVar14 = (*pTVar36->_vptr_TType[0x25])(pTVar36), iVar9 = local_1dc,
                   (char)iVar14 == '\0')) {
                  iVar9 = (*type->_vptr_TType[5])(type);
                  iVar10 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)CONCAT44(extraout_var_33,iVar9),"$Global");
                  iVar14 = local_1dc;
                  iVar9 = local_1dc;
                  if (iVar10 != 0) {
                    local_b4 = glslang::TIntermediate::getBaseAlignmentScalar(pTVar36,&local_1c4);
                    iVar10 = (*pTVar36->_vptr_TType[0x1d])(pTVar36);
                    iVar9 = local_b4;
                    if ((char)iVar10 != '\0') {
                      iVar9 = iVar14;
                    }
                    if (4 < local_b4) {
                      iVar9 = iVar14;
                    }
                    if (local_1e9 == false) {
                      iVar9 = iVar14;
                    }
                    if (explicitLayout == ElpStd140) {
                      iVar14 = (*pTVar36->_vptr_TType[0x1c])(pTVar36);
                      if ((char)iVar14 == '\0') {
                        iVar14 = (*pTVar36->_vptr_TType[0x1d])(pTVar36);
                        if ((char)iVar14 != '\0') {
                          local_1c0 = (_Rb_tree_header *)CONCAT44(local_1c0._4_4_,local_1c4);
                          iVar14 = (*pTVar36->_vptr_TType[0xc])(pTVar36);
                          spvMember = spvMember + (iVar14 + -4) * (int)local_1c0;
                        }
                      }
                      else {
                        local_1dc = local_1c4;
                        if ((int)local_1c0 == 1) {
                          iVar14 = (*pTVar36->_vptr_TType[0xd])(pTVar36);
                        }
                        else {
                          iVar14 = (*pTVar36->_vptr_TType[0xe])(pTVar36);
                        }
                        spvMember = spvMember + (iVar14 + -4) * local_1dc;
                      }
                    }
                  }
                }
                glslang::RoundToPow2<int>(&offset,iVar9);
                if (explicitLayout != ElpScalar) {
                  bVar8 = glslang::TIntermediate::improperStraddle
                                    (pTVar36,spvMember,offset,local_1e9);
                  if (bVar8) {
                    offset = offset + 0xfU & 0xfffffff0;
                  }
                }
                iVar9 = spvMember + offset;
                if (-1 < offset) {
                  spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DecorationOffset,offset);
                }
              }
            }
            else {
              iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
              spv::Builder::addMemberDecoration
                        (pBVar45,id,uVar42,DecorationOffset,
                         *(uint *)(CONCAT44(extraout_var_25,iVar9) + 0x24) >> 0x12 & 0x1fff);
              iVar9 = offset;
            }
            offset = iVar9;
            iVar9 = (*pTVar36->_vptr_TType[0x1c])(pTVar36);
            if ((explicitLayout != ElpNone) && ((char)iVar9 != '\0')) {
              glslang::TType::TType((TType *)&spvMember,EbtVoid,EvqTemporary,1,0,0,false);
              glslang::TType::shallowCopy((TType *)&spvMember,pTVar36);
              local_168.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
              glslang::TIntermediate::getMemberAlignment
                        ((TType *)&spvMember,&dummyStride,&local_1c4,explicitLayout,
                         ((ulong)local_1d0 & 0xe000000000000000) == 0x2000000000000000);
              spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DecorationMatrixStride,local_1c4);
            }
            iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
            num = TranslateBuiltInDecoration
                            (this,*(uint *)(CONCAT44(extraout_var_26,iVar9) + 8) >> 7 & 0x1ff,true);
            if (num != BuiltInMax) {
              spv::Builder::addMemberDecoration(pBVar45,id,uVar42,BuiltIn,num);
            }
            iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
            DVar13 = TranslateNonUniformDecoration
                               (this,*(TQualifier **)(CONCAT44(extraout_var_27,iVar9) + 8));
            spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DVar13,-1);
            pcVar34 = memberQualifier.semanticName;
            pBVar45 = local_1a0;
            if ((memberQualifier.semanticName != (char *)0x0 &
                this->glslangIntermediate->hlslFunctionality1) == 1) {
              spv::Builder::addExtension(local_1a0,"SPV_GOOGLE_hlsl_functionality1");
              spv::Builder::addMemberDecoration
                        (pBVar45,id,uVar42,DecorationHlslSemanticGOOGLE,pcVar34);
            }
            pBVar45 = local_1a0;
            p_Var35 = local_1b8;
            if (num == BuiltInLayer) {
              iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
              if (*(char *)(CONCAT44(extraout_var_28,iVar9) + 0x30) == '\x01') {
                spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DecorationViewportRelativeNV,-1)
                ;
                spvMember = 0x1487;
                std::
                _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                ::_M_insert_unique<spv::Capability_const&>
                          ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                            *)local_168.spirvType,&spvMember);
                spv::Builder::addExtension(pBVar45,"SPV_NV_viewport_array2");
              }
              iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
              if (*(int *)(CONCAT44(extraout_var_29,iVar9) + 0x34) != -0x800) {
                iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
                spv::Builder::addMemberDecoration
                          (pBVar45,id,uVar42,DecorationSecondaryViewportRelativeNV,
                           *(int *)(CONCAT44(extraout_var_30,iVar9) + 0x34));
                spvMember = 0x148b;
                std::
                _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                ::_M_insert_unique<spv::Capability_const&>
                          ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                            *)local_168.spirvType,&spvMember);
                spv::Builder::addExtension(pBVar45,"SPV_NV_stereo_view_rendering");
              }
            }
            iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
            if (*(char *)(CONCAT44(extraout_var_31,iVar9) + 0x2f) == '\x01') {
              spv::Builder::addMemberDecoration(pBVar45,id,uVar42,DecorationPassthroughNV,-1);
              spvMember = 0x1483;
              std::
              _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              ::_M_insert_unique<spv::Capability_const&>
                        ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                          *)local_168.spirvType,&spvMember);
              spv::Builder::addExtension(pBVar45,"SPV_NV_geometry_shader_passthrough");
            }
            iVar9 = (*pTVar36->_vptr_TType[10])(pTVar36);
            if (*(long *)(CONCAT44(extraout_var_32,iVar9) + 0x40) != 0) {
              applySpirvDecorate(this,pTVar36,id,(optional<int>)((ulong)uVar42 + 0x100000000));
            }
          }
        }
        p_Var35 = p_Var35 + 1;
        pTVar26 = (local_c0->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)p_Var35 <
               (long)(int)((ulong)((long)(local_c0->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar26)
                          >> 5));
    }
    DVar13 = TranslateLayoutDecoration
                       (type,(TLayoutMatrix)((ulong)*(undefined8 *)&local_1d8->field_0x8 >> 0x3d));
    spv::Builder::addDecoration(pBVar45,id,DVar13,-1);
    iVar9 = (*type->_vptr_TType[7])(type);
    iVar14 = (*type->_vptr_TType[0xb])(type);
    uVar42 = *(uint *)(CONCAT44(extraout_var_34,iVar14) + 8);
    uVar18 = uVar42 & 0x7f;
    if (iVar9 == 0xf) {
      pTVar31 = this->glslangIntermediate;
      if (((0 < (pTVar31->spvVersion).vulkan) &&
          (spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish)) &&
         ((this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start
          [spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]]->opCode == OpTypeRuntimeArray)) {
        if (0xe < uVar18) goto LAB_00441e74;
        DVar13 = Block;
        if ((0x7eb8U >> (uVar42 & 0x1f) & 1) == 0) {
          if (uVar18 != 6) goto LAB_00441e74;
          goto LAB_00441d8c;
        }
        goto LAB_004415db;
      }
    }
    else if (iVar9 == 0x10) {
      if (0xe < uVar18) {
LAB_00441e74:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x188,
                      "spv::Decoration (anonymous namespace)::TranslateBlockDecoration(const glslang::TStorageQualifier, bool)"
                     );
      }
      DVar13 = Block;
      if ((0x7eb8U >> (uVar42 & 0x1f) & 1) == 0) {
        if (uVar18 != 6) goto LAB_00441e74;
        pTVar31 = this->glslangIntermediate;
LAB_00441d8c:
        DVar13 = pTVar31->useStorageBuffer ^ BufferBlock;
      }
LAB_004415db:
      spv::Builder::addDecoration(local_1a0,id,DVar13,-1);
    }
    if (local_1d8->layoutHitObjectShaderRecordNV == true) {
      spv::Builder::addDecoration(local_1a0,id,DecorationHitObjectShaderRecordBufferNV,-1);
    }
    if (0 < (int)((ulong)((long)deferredForwardPointers.
                                super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)deferredForwardPointers.
                               super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d) {
      lVar29 = 0;
      lVar46 = 0;
      do {
        puVar39 = (undefined8 *)
                  ((long)&(deferredForwardPointers.
                           super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar29);
        pIVar38 = &spvMember;
        for (lVar30 = 0xb; lVar30 != 0; lVar30 = lVar30 + -1) {
          *(undefined8 *)pIVar38 = *puVar39;
          puVar39 = puVar39 + (ulong)bVar48 * -2 + 1;
          pIVar38 = pIVar38 + (ulong)bVar48 * -4 + 2;
        }
        convertGlslangToSpvType
                  (this,(TType *)_spvMember,explicitLayout,(TQualifier *)auStack_170,false,false);
        lVar46 = lVar46 + 1;
        lVar29 = lVar29 + 0x58;
      } while (lVar46 < (int)((ulong)((long)deferredForwardPointers.
                                            super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)deferredForwardPointers.
                                           super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d);
    }
    _Var6._M_p = (pointer)spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    pIVar7 = (pointer)spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (deferredForwardPointers.
        super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(deferredForwardPointers.
                      super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)deferredForwardPointers.
                            super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)deferredForwardPointers.
                            super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      _Var6._M_p = (pointer)spvMembers.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
      pIVar7 = (pointer)spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    goto joined_r0x00440c0e;
  case 0x11:
    pTVar31 = this->glslangIntermediate;
    if (5 < pTVar31->language - EShLangRayGen) {
      _spvMember = (pointer)&local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)&spvMember,"GL_EXT_ray_query","");
      cVar23 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pTVar31->requestedExtensions)._M_t,(key_type *)&spvMember);
      if ((TType *)_spvMember != &local_168) {
        operator_delete(_spvMember,(ulong)((long)local_168._vptr_TType + 1));
      }
      if ((_Rb_tree_header *)cVar23._M_node !=
          &(pTVar31->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) {
        spv::Builder::addExtension(&this->builder,"SPV_KHR_ray_query");
        spvMember = 0x1178;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities,&spvMember);
      }
    }
    id = spv::Builder::makeAccelerationStructureType(&this->builder);
    break;
  case 0x12:
    this_00 = &this->forwardPointers;
    iVar9 = (*type->_vptr_TType[0x15])(type);
    uVar44 = CONCAT44(extraout_var_08,iVar9);
    p_Var28 = (this->forwardPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var28 == (_Base_ptr)0x0) {
LAB_00440a00:
      IVar11 = spv::Builder::makeForwardPointer(&this->builder,PhysicalStorageBuffer);
      iVar9 = (*type->_vptr_TType[0x15])(type);
      _spvMember = (pointer)CONCAT44(extraout_var_09,iVar9);
      pmVar25 = std::
                map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
                ::operator[](this_00,(key_type *)&spvMember);
      *pmVar25 = IVar11;
    }
    else {
      p_Var32 = &(this->forwardPointers)._M_t._M_impl.super__Rb_tree_header;
      p_Var33 = &p_Var32->_M_header;
      do {
        if (*(ulong *)(p_Var28 + 1) >= uVar44) {
          p_Var33 = p_Var28;
        }
        p_Var28 = (&p_Var28->_M_left)[*(ulong *)(p_Var28 + 1) < uVar44];
      } while (p_Var28 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var33 == p_Var32) || (uVar44 < *(ulong *)(p_Var33 + 1)))
      goto LAB_00440a00;
    }
    iVar9 = (*type->_vptr_TType[0x15])(type);
    _spvMember = (pointer)CONCAT44(extraout_var_10,iVar9);
    pmVar25 = std::
              map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
              ::operator[](this_00,(key_type *)&spvMember);
    id = *pmVar25;
    if (!forwardReferenceOnly) {
      iVar9 = (*type->_vptr_TType[0x15])(type);
      IVar11 = convertGlslangToSpvType
                         (this,(TType *)CONCAT44(extraout_var_11,iVar9),forwardReferenceOnly_00);
      iVar9 = (*type->_vptr_TType[0x15])(type);
      _spvMember = (pointer)CONCAT44(extraout_var_12,iVar9);
      pmVar25 = std::
                map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
                ::operator[](this_00,(key_type *)&spvMember);
      spv::Builder::makePointerFromForwardPointer
                (&this->builder,PhysicalStorageBuffer,*pmVar25,IVar11);
    }
    break;
  case 0x13:
    pTVar31 = this->glslangIntermediate;
    memberQualifier.semanticName = (char *)0x10;
    _spvMember = (pointer)&local_168;
    _spvMember = (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&spvMember,(ulong)&memberQualifier);
    local_168._vptr_TType = (_func_int **)memberQualifier.semanticName;
    ((TType *)_spvMember)->_vptr_TType = (_func_int **)0x725f5458455f4c47;
    ((TType *)_spvMember)->field_0x8 = 'a';
    ((TType *)_spvMember)->field_0x9 = 'y';
    ((TType *)_spvMember)->field_0xa = '_';
    ((TType *)_spvMember)->field_0xb = 'q';
    ((TType *)_spvMember)->field_0xc = 'u';
    ((TType *)_spvMember)->field_0xd = 'e';
    ((TType *)_spvMember)->field_0xe = 'r';
    ((TType *)_spvMember)->field_0xf = 'y';
    auStack_170 = (undefined1  [8])memberQualifier.semanticName;
    *(char *)((long)&((TType *)_spvMember)->_vptr_TType + (long)memberQualifier.semanticName) = '\0'
    ;
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&(pTVar31->requestedExtensions)._M_t,(key_type *)&spvMember);
    if ((TType *)_spvMember != &local_168) {
      operator_delete(_spvMember,(ulong)((long)local_168._vptr_TType + 1));
    }
    if ((_Rb_tree_header *)cVar23._M_node !=
        &(pTVar31->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) {
      spv::Builder::addExtension(&this->builder,"SPV_KHR_ray_query");
      spvMember = 0x1178;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,&spvMember);
    }
    id = spv::Builder::makeRayQueryType(&this->builder);
    break;
  case 0x14:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_invocation_reorder");
    spvMember = 0x1507;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&spvMember);
    id = spv::Builder::makeHitObjectNVType(&this->builder);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1442,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                 );
  case 0x17:
    spvMember = 0x153f;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_tensor_addressing");
    _spvMember = (pointer)0x0;
    auStack_170 = (undefined1  [8])0x0;
    local_168._vptr_TType = (_func_int **)0x0;
    iVar9 = 0;
    bVar8 = true;
    do {
      bVar43 = bVar8;
      iVar14 = (*type->_vptr_TType[0x16])(type);
      IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_06,iVar14) + 8),iVar9,
                               true,false);
      memberQualifier.semanticName = (char *)CONCAT71(memberQualifier.semanticName._1_7_,1);
      memberQualifier.semanticName = (char *)CONCAT44(IVar11,(int)memberQualifier.semanticName);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
      emplace_back<spv::IdImmediate>
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                 (IdImmediate *)&memberQualifier);
      iVar9 = 1;
      bVar8 = false;
    } while (bVar43);
    opcode = OpTypeTensorLayoutNV;
    goto LAB_00440b98;
  case 0x18:
    spvMember = 0x153f;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_tensor_addressing");
    iVar9 = (*type->_vptr_TType[0x16])(type);
    iVar14 = 0;
    uVar42 = glslang::TSmallArrayVector::getDimSize
                       (*(TSmallArrayVector **)(CONCAT44(extraout_var_13,iVar9) + 8),0);
    if (4 < uVar42 - 1) {
      __assert_fail("dim >= 1 && dim <= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1439,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    _spvMember = (pointer)0x0;
    auStack_170 = (undefined1  [8])0x0;
    local_168._vptr_TType = (_func_int **)0x0;
    do {
      iVar9 = (*type->_vptr_TType[0x16])(type);
      IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_14,iVar9) + 8),iVar14,
                               true,iVar14 == 1);
      memberQualifier.semanticName = (char *)CONCAT71(memberQualifier.semanticName._1_7_,1);
      memberQualifier.semanticName = (char *)CONCAT44(IVar11,(int)memberQualifier.semanticName);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
      emplace_back<spv::IdImmediate>
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                 (IdImmediate *)&memberQualifier);
      iVar14 = iVar14 + 1;
    } while (uVar42 + 2 != iVar14);
    opcode = OpTypeTensorViewNV;
LAB_00440b98:
    local_1e8 = &this->builder;
    id = spv::Builder::makeGenericType
                   (local_1e8,opcode,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember);
    if ((TType *)_spvMember != (TType *)0x0) {
      operator_delete(_spvMember,(long)local_168._vptr_TType - (long)_spvMember);
    }
    break;
  case 0x1a:
    this_01 = type->spirvType;
    if (this_01 == (TSpirvType *)0x0) {
      __assert_fail("spirvType",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0xb43,"const TSpirvType &glslang::TType::getSpirvType() const");
    }
    _spvMember = (pointer)0x0;
    auStack_170 = (undefined1  [8])0x0;
    local_168._vptr_TType = (_func_int **)0x0;
    pTVar47 = (this_01->typeParams).
              super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              .
              super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (this_01->typeParams).
             super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             .
             super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar47 != pTVar4) {
      do {
        _Var2 = (pTVar47->value).
                super__Variant_base<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
                super__Move_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Copy_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Move_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Copy_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Variant_storage_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                ._M_index;
        this_02 = *(TGlslangToSpvTraverser **)
                   &(pTVar47->value).
                    super__Variant_base<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                    .
                    super__Move_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                    .
                    super__Copy_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                    .
                    super__Move_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                    .
                    super__Copy_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
        ;
        if (this_02 == (TGlslangToSpvTraverser *)0x0 || _Var2 != '\0') {
          if ((_Var2 != '\x01') || (this_02 == (TGlslangToSpvTraverser *)0x0)) {
            __assert_fail("typeParam.getAsType() != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x141d,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                         );
          }
          explicitLayout_00 = getExplicitLayout(this_02,pTVar36);
          iVar9 = (*(this_02->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this_02);
          IVar11 = convertGlslangToSpvType
                             (this,(TType *)this_02,explicitLayout_00,
                              (TQualifier *)CONCAT44(extraout_var_05,iVar9),false,false);
LAB_00440412:
          memberQualifier.semanticName = (char *)CONCAT71(memberQualifier.semanticName._1_7_,1);
LAB_0044041a:
          memberQualifier.semanticName = (char *)CONCAT44(IVar11,(int)memberQualifier.semanticName);
LAB_00440421:
          pTVar36 = (TType *)&memberQualifier;
          std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
          emplace_back<spv::IdImmediate>
                    ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                     (IdImmediate *)&memberQualifier);
        }
        else {
          if (*(char *)&(this_02->builder).sourceText._M_dataplus._M_p != '\x01') {
            IVar11 = createSpvConstant(this,(TIntermTyped *)this_02);
            goto LAB_00440412;
          }
          iVar9 = (*(this_02->super_TIntermTraverser)._vptr_TIntermTraverser[0x20])(this_02);
          if (iVar9 == 1) {
            memberQualifier.semanticName =
                 (char *)(CONCAT44((float)**(double **)
                                            (*(long *)&(this_02->builder).debugExpression + 8),
                                   (int)memberQualifier.semanticName) & 0xffffffffffffff00);
            goto LAB_00440421;
          }
          iVar9 = (*(this_02->super_TIntermTraverser)._vptr_TIntermTraverser[0x20])(this_02);
          if ((iVar9 == 8) ||
             (iVar9 = (*(this_02->super_TIntermTraverser)._vptr_TIntermTraverser[0x20])(this_02),
             iVar9 == 9)) {
            IVar11 = **(Id **)(*(long *)&(this_02->builder).debugExpression + 8);
LAB_00440474:
            memberQualifier.semanticName._0_4_ =
                 (int)((ulong)memberQualifier.semanticName >> 8) << 8;
            goto LAB_0044041a;
          }
          iVar9 = (*(this_02->super_TIntermTraverser)._vptr_TIntermTraverser[0x20])(this_02);
          if (iVar9 == 0xc) {
            IVar11 = (uint)**(byte **)(*(long *)&(this_02->builder).debugExpression + 8);
            goto LAB_00440474;
          }
          iVar9 = (*(this_02->super_TIntermTraverser)._vptr_TIntermTraverser[0x20])(this_02);
          if (iVar9 != 0x1b) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x1418,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                         );
          }
          pcVar34 = *(char **)(**(long **)(*(long *)&(this_02->builder).debugExpression + 8) + 8);
          spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)spvMembers.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          __s = &spvMembers;
          uVar42 = 0;
          do {
            while( true ) {
              uVar18 = uVar42;
              cVar3 = *pcVar34;
              pcVar34 = pcVar34 + 1;
              *(char *)&(__s->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start = cVar3;
              uVar42 = uVar18 + 1;
              if (uVar42 == 4) break;
              __s = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((long)&(__s->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
              if (cVar3 == '\0') {
                if (uVar42 != 0) {
                  if (uVar42 < 4) {
                    memset(__s,0,(ulong)(3 - uVar18));
                  }
                  IVar11 = (Id)spvMembers.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                  goto LAB_00440474;
                }
                goto LAB_00440431;
              }
            }
            memberQualifier.semanticName =
                 (char *)(CONCAT44((Id)spvMembers.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                   (int)memberQualifier.semanticName) & 0xffffffffffffff00);
            pTVar36 = (TType *)&memberQualifier;
            std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
            emplace_back<spv::IdImmediate>
                      ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                       (IdImmediate *)&memberQualifier);
            __s = &spvMembers;
            uVar42 = 0;
          } while (cVar3 != '\0');
        }
LAB_00440431:
        pTVar47 = pTVar47 + 1;
      } while (pTVar47 != pTVar4);
    }
    iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      this_01,"");
    if (iVar9 != 0) {
      __assert_fail("spirvInst.set == \"\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1422,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    id = spv::Builder::makeGenericType
                   (&this->builder,(this_01->spirvInst).id,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember);
    _Var6._M_p = _spvMember;
    pIVar7 = (pointer)local_168._vptr_TType;
joined_r0x00440c0e:
    if ((TType *)_Var6._M_p != (TType *)0x0) {
      operator_delete(_Var6._M_p,(long)pIVar7 - (long)_Var6._M_p);
    }
    break;
  case 0x1b:
    return 0;
  }
  iVar9 = (*type->_vptr_TType[0x1c])(type);
  if ((char)iVar9 == '\0') {
    iVar9 = (*type->_vptr_TType[0xc])(type);
    if (1 < iVar9) {
      iVar9 = (*type->_vptr_TType[0xc])(type);
      id = spv::Builder::makeVectorType(&this->builder,id,iVar9);
    }
  }
  else {
    iVar9 = (*type->_vptr_TType[0xd])(type);
    iVar14 = (*type->_vptr_TType[0xe])(type);
    id = spv::Builder::makeMatrixType(&this->builder,id,iVar9,iVar14);
  }
  uVar42 = *(uint *)&type->field_0x8;
  if ((uVar42 >> 0x15 & 1) != 0) {
    spvMember = 0x14ed;
    psVar1 = &(this->builder).capabilities;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)psVar1,&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cooperative_matrix");
    iVar9 = (*type->_vptr_TType[7])(type);
    if (iVar9 == 3) {
      spvMember = 9;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar1,&spvMember);
    }
    iVar9 = (*type->_vptr_TType[7])(type);
    if ((iVar9 == 5) || (iVar9 = (*type->_vptr_TType[7])(type), iVar9 == 4)) {
      spvMember = 0x27;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar1,&spvMember);
    }
    iVar9 = (*type->_vptr_TType[0x16])(type);
    IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_35,iVar9) + 8),1,false,
                             false);
    iVar9 = (*type->_vptr_TType[0x16])(type);
    IVar15 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_36,iVar9) + 8),2,false,
                             false);
    iVar9 = (*type->_vptr_TType[0x16])(type);
    IVar16 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_37,iVar9) + 8),3,false,
                             false);
    id = spv::Builder::makeCooperativeMatrixTypeNV(&this->builder,id,IVar11,IVar15,IVar16);
    uVar42 = *(uint *)&type->field_0x8;
  }
  if ((uVar42 >> 0x16 & 1) != 0) {
    pBVar45 = &this->builder;
    spvMember = 0x1786;
    psVar1 = &(this->builder).capabilities;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)psVar1,&spvMember);
    spv::Builder::addExtension(pBVar45,"SPV_KHR_cooperative_matrix");
    iVar9 = (*type->_vptr_TType[7])(type);
    if (iVar9 == 3) {
      spvMember = 9;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar1,&spvMember);
    }
    iVar9 = (*type->_vptr_TType[7])(type);
    if ((iVar9 == 5) || (iVar9 = (*type->_vptr_TType[7])(type), iVar9 == 4)) {
      spvMember = 0x27;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar1,&spvMember);
    }
    iVar9 = (*type->_vptr_TType[0x16])(type);
    IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_38,iVar9) + 8),0,false,
                             false);
    iVar9 = (*type->_vptr_TType[0x16])(type);
    IVar15 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_39,iVar9) + 8),1,false,
                             false);
    iVar9 = (*type->_vptr_TType[0x16])(type);
    IVar16 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_40,iVar9) + 8),2,false,
                             false);
    uVar42 = *(uint *)&type->field_0x8;
    IVar17 = spv::Builder::makeIntegerType(pBVar45,0x20,false);
    IVar17 = spv::Builder::makeIntConstant(pBVar45,IVar17,uVar42 >> 0x17 & 7,false);
    id = spv::Builder::makeCooperativeMatrixTypeKHR(pBVar45,id,IVar11,IVar15,IVar16,IVar17);
    uVar42 = *(uint *)&type->field_0x8;
  }
  if ((uVar42 >> 0x1b & 1) != 0) {
    spvMember = 0x1512;
    psVar1 = &(this->builder).capabilities;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)psVar1,&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cooperative_vector");
    iVar9 = (*type->_vptr_TType[7])(type);
    if (iVar9 == 3) {
      spvMember = 9;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar1,&spvMember);
    }
    iVar9 = (*type->_vptr_TType[7])(type);
    if ((iVar9 == 5) || (iVar9 = (*type->_vptr_TType[7])(type), iVar9 == 4)) {
      spvMember = 0x27;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar1,&spvMember);
    }
    iVar9 = (*type->_vptr_TType[0x16])(type);
    IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_41,iVar9) + 8),0,false,
                             false);
    id = spv::Builder::makeCooperativeVectorTypeNV(&this->builder,id,IVar11);
  }
  iVar9 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar9 != '\0') {
    iVar9 = (*type->_vptr_TType[0x13])(type);
    lVar29 = *(long *)(CONCAT44(extraout_var_42,iVar9) + 8);
    if ((lVar29 == 0) || ((int)((ulong)(*(long *)(lVar29 + 0x10) - *(long *)(lVar29 + 8)) >> 4) < 2)
       ) {
      iVar9 = 0;
      if ((explicitLayout != ElpNone) &&
         (iVar14 = (*type->_vptr_TType[7])(type), iVar9 = 0, iVar14 != 0x10)) {
        glslang::TIntermediate::getMemberAlignment
                  (type,(int *)&spvMember,(int *)&memberQualifier,explicitLayout,
                   (uint)((ulong)*(undefined8 *)&local_1d8->field_0x8 >> 0x3d) == 1);
        iVar9 = (int)memberQualifier.semanticName;
      }
    }
    else {
      iVar9 = 0;
      if ((explicitLayout != ElpNone) && (iVar14 = (*type->_vptr_TType[7])(type), iVar14 != 0x10)) {
        glslang::TType::TType((TType *)&spvMember,type,0,false);
        while ((pTVar5 = *(TVector<glslang::TArraySize> **)
                          &((local_168.qualifier.spirvDecorate)->decorates).
                           super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                           ._M_t._M_impl.field_0x8, pTVar5 != (TVector<glslang::TArraySize> *)0x0 &&
               (1 < (int)((ulong)((long)(pTVar5->
                                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ).
                                        super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pTVar5->
                                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                       ).
                                       super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4)))) {
          glslang::TSmallArrayVector::pop_front
                    ((TSmallArrayVector *)local_168.qualifier.spirvDecorate);
        }
        glslang::TIntermediate::getMemberAlignment
                  ((TType *)&spvMember,(int *)&memberQualifier,(int *)&spvMembers,explicitLayout,
                   (uint)((ulong)*(undefined8 *)&local_1d8->field_0x8 >> 0x3d) == 1);
        iVar9 = (Id)spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      }
      iVar14 = (*type->_vptr_TType[0x13])(type);
      lVar29 = *(long *)(CONCAT44(extraout_var_43,iVar14) + 8);
      if ((lVar29 != 0) &&
         (iVar14 = (int)((ulong)(*(long *)(lVar29 + 0x10) - *(long *)(lVar29 + 8)) >> 4), 1 < iVar14
         )) {
        uVar42 = iVar14 + 1;
        do {
          iVar14 = (*type->_vptr_TType[0x13])(type);
          IVar11 = makeArraySizeId(this,(TArraySizes *)CONCAT44(extraout_var_44,iVar14),uVar42 - 2,
                                   false,false);
          id = spv::Builder::makeArrayType(&this->builder,id,IVar11,iVar9);
          if (0 < iVar9) {
            spv::Builder::addDecoration(&this->builder,id,ArrayStride,iVar9);
          }
          iVar14 = (*type->_vptr_TType[0x13])(type);
          uVar18 = glslang::TSmallArrayVector::getDimSize
                             ((TSmallArrayVector *)CONCAT44(extraout_var_45,iVar14),uVar42 - 2);
          iVar9 = iVar9 * uVar18;
          uVar42 = uVar42 - 1;
        } while (2 < uVar42);
      }
    }
    iVar14 = (*type->_vptr_TType[0x1e])(type);
    if ((char)iVar14 == '\0') {
      if ((char)local_b0 == '\0') {
        if ((this->builder).spvVersion < 0x10500) {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_descriptor_indexing");
        }
        spvMember = 0x14b6;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities,&spvMember);
      }
      id = spv::Builder::makeRuntimeArray(&this->builder,id);
    }
    else {
      iVar14 = (*type->_vptr_TType[0x13])(type);
      IVar11 = makeArraySizeId(this,(TArraySizes *)CONCAT44(extraout_var_46,iVar14),0,false,false);
      id = spv::Builder::makeArrayType(&this->builder,id,IVar11,iVar9);
    }
    if (0 < iVar9) {
      spv::Builder::addDecoration(&this->builder,id,ArrayStride,iVar9);
    }
  }
  return id;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType& type,
    glslang::TLayoutPacking explicitLayout, const glslang::TQualifier& qualifier,
    bool lastBufferBlockMember, bool forwardReferenceOnly)
{
    spv::Id spvType = spv::NoResult;

    switch (type.getBasicType()) {
    case glslang::EbtVoid:
        spvType = builder.makeVoidType();
        assert (! type.isArray());
        break;
    case glslang::EbtBool:
        // "transparent" bool doesn't exist in SPIR-V.  The GLSL convention is
        // a 32-bit int where non-0 means true.
        if (explicitLayout != glslang::ElpNone)
            spvType = builder.makeUintType(32);
        else
            spvType = builder.makeBoolType();
        break;
    case glslang::EbtInt:
        spvType = builder.makeIntType(32);
        break;
    case glslang::EbtUint:
        spvType = builder.makeUintType(32);
        break;
    case glslang::EbtFloat:
        spvType = builder.makeFloatType(32);
        break;
    case glslang::EbtDouble:
        spvType = builder.makeFloatType(64);
        break;
    case glslang::EbtFloat16:
        spvType = builder.makeFloatType(16);
        break;
    case glslang::EbtInt8:
        spvType = builder.makeIntType(8);
        break;
    case glslang::EbtUint8:
        spvType = builder.makeUintType(8);
        break;
    case glslang::EbtInt16:
        spvType = builder.makeIntType(16);
        break;
    case glslang::EbtUint16:
        spvType = builder.makeUintType(16);
        break;
    case glslang::EbtInt64:
        spvType = builder.makeIntType(64);
        break;
    case glslang::EbtUint64:
        spvType = builder.makeUintType(64);
        break;
    case glslang::EbtAtomicUint:
        builder.addCapability(spv::CapabilityAtomicStorage);
        spvType = builder.makeUintType(32);
        break;
    case glslang::EbtAccStruct:
        switch (glslangIntermediate->getStage()) {
        case EShLangRayGen:
        case EShLangIntersect:
        case EShLangAnyHit:
        case EShLangClosestHit:
        case EShLangMiss:
        case EShLangCallable:
            // these all should have the RayTracingNV/KHR capability already
            break;
        default:
            {
                auto& extensions = glslangIntermediate->getRequestedExtensions();
                if (extensions.find("GL_EXT_ray_query") != extensions.end()) {
                    builder.addExtension(spv::E_SPV_KHR_ray_query);
                    builder.addCapability(spv::CapabilityRayQueryKHR);
                }
            }
            break;
        }
        spvType = builder.makeAccelerationStructureType();
        break;
    case glslang::EbtRayQuery:
        {
            auto& extensions = glslangIntermediate->getRequestedExtensions();
            if (extensions.find("GL_EXT_ray_query") != extensions.end()) {
                builder.addExtension(spv::E_SPV_KHR_ray_query);
                builder.addCapability(spv::CapabilityRayQueryKHR);
            }
            spvType = builder.makeRayQueryType();
        }
        break;
    case glslang::EbtReference:
        {
            // Make the forward pointer, then recurse to convert the structure type, then
            // patch up the forward pointer with a real pointer type.
            if (forwardPointers.find(type.getReferentType()) == forwardPointers.end()) {
                spv::Id forwardId = builder.makeForwardPointer(spv::StorageClassPhysicalStorageBufferEXT);
                forwardPointers[type.getReferentType()] = forwardId;
            }
            spvType = forwardPointers[type.getReferentType()];
            if (!forwardReferenceOnly) {
                spv::Id referentType = convertGlslangToSpvType(*type.getReferentType());
                builder.makePointerFromForwardPointer(spv::StorageClassPhysicalStorageBufferEXT,
                                                      forwardPointers[type.getReferentType()],
                                                      referentType);
            }
        }
        break;
    case glslang::EbtSampler:
        {
            const glslang::TSampler& sampler = type.getSampler();
            if (sampler.isPureSampler()) {
                spvType = builder.makeSamplerType();
            } else {
                // an image is present, make its type
                spvType = builder.makeImageType(getSampledType(sampler), TranslateDimensionality(sampler),
                                                sampler.isShadow(), sampler.isArrayed(), sampler.isMultiSample(),
                                                sampler.isImageClass() ? 2 : 1, TranslateImageFormat(type));
                if (sampler.isCombined() &&
                    (!sampler.isBuffer() || glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_6)) {
                    // Already has both image and sampler, make the combined type. Only combine sampler to
                    // buffer if before SPIR-V 1.6.
                    spvType = builder.makeSampledImageType(spvType);
                }
            }
        }
        break;
    case glslang::EbtStruct:
    case glslang::EbtBlock:
        {
            // If we've seen this struct type, return it
            const glslang::TTypeList* glslangMembers = type.getStruct();

            // Try to share structs for different layouts, but not yet for other
            // kinds of qualification (primarily not yet including interpolant qualification).
            if (! HasNonLayoutQualifiers(type, qualifier))
                spvType = structMap[explicitLayout][qualifier.layoutMatrix][glslangMembers];
            if (spvType != spv::NoResult)
                break;

            // else, we haven't seen it...
            if (type.getBasicType() == glslang::EbtBlock)
                memberRemapper[glslangTypeToIdMap[glslangMembers]].resize(glslangMembers->size());
            spvType = convertGlslangStructToSpvType(type, glslangMembers, explicitLayout, qualifier);
        }
        break;
    case glslang::EbtString:
        // no type used for OpString
        return 0;

    case glslang::EbtHitObjectNV: {
        builder.addExtension(spv::E_SPV_NV_shader_invocation_reorder);
        builder.addCapability(spv::CapabilityShaderInvocationReorderNV);
        spvType = builder.makeHitObjectNVType();
    }
    break;
    case glslang::EbtSpirvType: {
        // GL_EXT_spirv_intrinsics
        const auto& spirvType = type.getSpirvType();
        const auto& spirvInst = spirvType.spirvInst;

        std::vector<spv::IdImmediate> operands;
        for (const auto& typeParam : spirvType.typeParams) {
            if (typeParam.getAsConstant() != nullptr) {
                // Constant expression
                auto constant = typeParam.getAsConstant();
                if (constant->isLiteral()) {
                    if (constant->getBasicType() == glslang::EbtFloat) {
                        float floatValue = static_cast<float>(constant->getConstArray()[0].getDConst());
                        unsigned literal;
                        static_assert(sizeof(literal) == sizeof(floatValue), "sizeof(unsigned) != sizeof(float)");
                        memcpy(&literal, &floatValue, sizeof(literal));
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtInt) {
                        unsigned literal = constant->getConstArray()[0].getIConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtUint) {
                        unsigned literal = constant->getConstArray()[0].getUConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtBool) {
                        unsigned literal = constant->getConstArray()[0].getBConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtString) {
                        auto str = constant->getConstArray()[0].getSConst()->c_str();
                        unsigned literal = 0;
                        char* literalPtr = reinterpret_cast<char*>(&literal);
                        unsigned charCount = 0;
                        char ch = 0;
                        do {
                            ch = *(str++);
                            *(literalPtr++) = ch;
                            ++charCount;
                            if (charCount == 4) {
                                operands.push_back({false, literal});
                                literalPtr = reinterpret_cast<char*>(&literal);
                                charCount = 0;
                            }
                        } while (ch != 0);

                        // Partial literal is padded with 0
                        if (charCount > 0) {
                            for (; charCount < 4; ++charCount)
                                *(literalPtr++) = 0;
                            operands.push_back({false, literal});
                        }
                    } else
                        assert(0); // Unexpected type
                } else
                    operands.push_back({true, createSpvConstant(*constant)});
            } else {
                // Type specifier
                assert(typeParam.getAsType() != nullptr);
                operands.push_back({true, convertGlslangToSpvType(*typeParam.getAsType())});
            }
        }

        assert(spirvInst.set == ""); // Currently, couldn't be extended instructions.
        spvType = builder.makeGenericType(static_cast<spv::Op>(spirvInst.id), operands);

        break;
    }
    case glslang::EbtTensorLayoutNV:
    {
        builder.addCapability(spv::CapabilityTensorAddressingNV);
        builder.addExtension(spv::E_SPV_NV_tensor_addressing);

        std::vector<spv::IdImmediate> operands;
        for (uint32_t i = 0; i < 2; ++i) {
            operands.push_back({true, makeArraySizeId(*type.getTypeParameters()->arraySizes, i, true)});
        }
        spvType = builder.makeGenericType(spv::OpTypeTensorLayoutNV, operands);
        break;
    }
    case glslang::EbtTensorViewNV:
    {
        builder.addCapability(spv::CapabilityTensorAddressingNV);
        builder.addExtension(spv::E_SPV_NV_tensor_addressing);

        uint32_t dim = type.getTypeParameters()->arraySizes->getDimSize(0);
        assert(dim >= 1 && dim <= 5);
        std::vector<spv::IdImmediate> operands;
        for (uint32_t i = 0; i < dim + 2; ++i) {
            operands.push_back({true, makeArraySizeId(*type.getTypeParameters()->arraySizes, i, true, i==1)});
        }
        spvType = builder.makeGenericType(spv::OpTypeTensorViewNV, operands);
        break;
    }
    default:
        assert(0);
        break;
    }

    if (type.isMatrix())
        spvType = builder.makeMatrixType(spvType, type.getMatrixCols(), type.getMatrixRows());
    else {
        // If this variable has a vector element count greater than 1, create a SPIR-V vector
        if (type.getVectorSize() > 1)
            spvType = builder.makeVectorType(spvType, type.getVectorSize());
    }

    if (type.isCoopMatNV()) {
        builder.addCapability(spv::CapabilityCooperativeMatrixNV);
        builder.addExtension(spv::E_SPV_NV_cooperative_matrix);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 ||
            type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id scope = makeArraySizeId(*type.getTypeParameters()->arraySizes, 1);
        spv::Id rows = makeArraySizeId(*type.getTypeParameters()->arraySizes, 2);
        spv::Id cols = makeArraySizeId(*type.getTypeParameters()->arraySizes, 3);

        spvType = builder.makeCooperativeMatrixTypeNV(spvType, scope, rows, cols);
    }

    if (type.isCoopMatKHR()) {
        builder.addCapability(spv::CapabilityCooperativeMatrixKHR);
        builder.addExtension(spv::E_SPV_KHR_cooperative_matrix);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 || type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id scope = makeArraySizeId(*type.getTypeParameters()->arraySizes, 0);
        spv::Id rows = makeArraySizeId(*type.getTypeParameters()->arraySizes, 1);
        spv::Id cols = makeArraySizeId(*type.getTypeParameters()->arraySizes, 2);
        spv::Id use = builder.makeUintConstant(type.getCoopMatKHRuse());

        spvType = builder.makeCooperativeMatrixTypeKHR(spvType, scope, rows, cols, use);
    }

    if (type.isCoopVecNV()) {
        builder.addCapability(spv::CapabilityCooperativeVectorNV);
        builder.addExtension(spv::E_SPV_NV_cooperative_vector);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 || type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id components = makeArraySizeId(*type.getTypeParameters()->arraySizes, 0);

        spvType = builder.makeCooperativeVectorTypeNV(spvType, components);
    }

    if (type.isArray()) {
        int stride = 0;  // keep this 0 unless doing an explicit layout; 0 will mean no decoration, no stride

        // Do all but the outer dimension
        if (type.getArraySizes()->getNumDims() > 1) {
            // We need to decorate array strides for types needing explicit layout, except blocks.
            if (explicitLayout != glslang::ElpNone && type.getBasicType() != glslang::EbtBlock) {
                // Use a dummy glslang type for querying internal strides of
                // arrays of arrays, but using just a one-dimensional array.
                glslang::TType simpleArrayType(type, 0); // deference type of the array
                while (simpleArrayType.getArraySizes()->getNumDims() > 1)
                    simpleArrayType.getArraySizes()->dereference();

                // Will compute the higher-order strides here, rather than making a whole
                // pile of types and doing repetitive recursion on their contents.
                stride = getArrayStride(simpleArrayType, explicitLayout, qualifier.layoutMatrix);
            }

            // make the arrays
            for (int dim = type.getArraySizes()->getNumDims() - 1; dim > 0; --dim) {
                spvType = builder.makeArrayType(spvType, makeArraySizeId(*type.getArraySizes(), dim), stride);
                if (stride > 0)
                    builder.addDecoration(spvType, spv::DecorationArrayStride, stride);
                stride *= type.getArraySizes()->getDimSize(dim);
            }
        } else {
            // single-dimensional array, and don't yet have stride

            // We need to decorate array strides for types needing explicit layout, except blocks.
            if (explicitLayout != glslang::ElpNone && type.getBasicType() != glslang::EbtBlock)
                stride = getArrayStride(type, explicitLayout, qualifier.layoutMatrix);
        }

        // Do the outer dimension, which might not be known for a runtime-sized array.
        // (Unsized arrays that survive through linking will be runtime-sized arrays)
        if (type.isSizedArray())
            spvType = builder.makeArrayType(spvType, makeArraySizeId(*type.getArraySizes(), 0), stride);
        else {
            if (!lastBufferBlockMember) {
                builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
                builder.addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
            }
            spvType = builder.makeRuntimeArray(spvType);
        }
        if (stride > 0)
            builder.addDecoration(spvType, spv::DecorationArrayStride, stride);
    }

    return spvType;
}